

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall
ON_SubDToBrepParameters::Read(ON_SubDToBrepParameters *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  bool bPackFaces;
  uint u;
  int version;
  bool local_21;
  uint local_20;
  int local_1c;
  
  this->m_bPackFaces = false;
  this->m_extraordinary_vertex_process = LocalG1x;
  this->m_reserved1 = 0;
  this->m_reserved2 = 0;
  this->m_reserved3 = 0.0;
  local_1c = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(archive,&local_1c);
  if (!bVar1) {
    return false;
  }
  if (0 < local_1c) {
    local_21 = this->m_bPackFaces;
    bVar1 = ON_BinaryArchive::ReadBool(archive,&local_21);
    if (bVar1) {
      this->m_bPackFaces = local_21;
      local_20 = (uint)this->m_extraordinary_vertex_process;
      bVar1 = ON_BinaryArchive::ReadInt(archive,&local_20);
      if (bVar1) {
        uVar3 = local_20;
        if (4 < local_20) {
          ON_SubDIncrementErrorCount();
          uVar3 = 0;
        }
        this->m_extraordinary_vertex_process = (VertexProcess)uVar3;
      }
      goto LAB_005cdaa4;
    }
  }
  bVar1 = false;
LAB_005cdaa4:
  bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_SubDToBrepParameters::Read(ON_BinaryArchive& archive)
{
  *this = ON_SubDToBrepParameters::Default;
  int version = 0;
  if (false == archive.BeginRead3dmAnonymousChunk(&version))
    return false;

  bool rc = false;
  for (;;)
  {
    if (version < 1)
      break;

    bool bPackFaces = this->PackFaces();
    if (false == archive.ReadBool(&bPackFaces))
      break;
    this->SetPackFaces(bPackFaces);

    unsigned u = static_cast<unsigned char>(this->ExtraordinaryVertexProcess());
    if (false == archive.ReadInt(&u))
      break;
    ON_SubDToBrepParameters::VertexProcess exvtx = ON_SubDToBrepParameters::VertexProcessFromUnsigned(u);
    this->SetExtraordinaryVertexProcess(exvtx);

    rc = true;
    break;
  }

  if (false == archive.EndRead3dmChunk())
    rc = false;
  return rc;
}